

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O0

Throw * __thiscall
wasm::Builder::makeThrow<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
          (Builder *this,Name tag,
          vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *args)

{
  Throw *pTVar1;
  Throw *ret;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *args_local;
  Builder *this_local;
  Name tag_local;
  
  tag_local.super_IString.str._M_len = tag.super_IString.str._M_str;
  this_local = tag.super_IString.str._M_len;
  pTVar1 = MixedArena::alloc<wasm::Throw>(&this->wasm->allocator);
  Name::operator=(&pTVar1->tag,(Name *)&this_local);
  ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*>::
  set<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
            ((ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*> *)&pTVar1->operands,
             args);
  wasm::Throw::finalize();
  return pTVar1;
}

Assistant:

Throw* makeThrow(Name tag, const T& args) {
    auto* ret = wasm.allocator.alloc<Throw>();
    ret->tag = tag;
    ret->operands.set(args);
    ret->finalize();
    return ret;
  }